

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O2

_Bool player_inc_check(player *p,wchar_t idx,_Bool lore)

{
  _Bool _Var1;
  monster_conflict *mon;
  long lVar2;
  char *fi;
  int flag;
  undefined1 *puVar3;
  size_t size;
  player_state_conflict *ppVar4;
  wchar_t wVar5;
  undefined1 *puVar6;
  bitflag *flags;
  char *fl;
  timed_failure *ptVar7;
  byte bVar8;
  player_state_conflict in_stack_fffffffffffffd28;
  undefined1 local_170 [320];
  
  bVar8 = 0;
  ptVar7 = (timed_failure *)&timed_effects[idx].fail;
LAB_001b31b2:
  do {
    ptVar7 = ptVar7->next;
    if (ptVar7 == (timed_failure *)0x0) goto LAB_001b33be;
    switch(ptVar7->code) {
    case 1:
      if (lore) {
        flag = ptVar7->idx;
        size = 6;
        fi = "p->known_state.flags";
        flags = (p->known_state).flags;
LAB_001b3280:
        fl = "f->idx";
        goto LAB_001b32eb;
      }
      if (cave->mon_current < L'\x01') {
        mon = (monster_conflict *)0x0;
      }
      else {
        mon = (monster_conflict *)cave_monster(cave,cave->mon_current);
      }
      equip_learn_flag(p,ptVar7->idx);
      if (mon != (monster_conflict *)0x0) {
        update_smart_learn(mon,p,ptVar7->idx,L'\0',L'\xffffffff');
      }
      _Var1 = player_of_has(p,ptVar7->idx);
      if (_Var1) {
        if (mon != (monster_conflict *)0x0) {
          msg("You resist the effect!");
        }
        goto LAB_001b33be;
      }
      goto LAB_001b31b2;
    case 2:
      wVar5 = ptVar7->idx;
      if (0x1b < (uint)wVar5) {
        __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                      ,0x3cb,"_Bool player_inc_check(struct player *, int, _Bool)");
      }
      if (lore) {
        memcpy(local_170,&p->known_state,0x13c);
        puVar3 = local_170;
        puVar6 = &stack0xfffffffffffffd28;
        for (lVar2 = 0x13c; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar6 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        }
      }
      else {
        equip_learn_element(p,wVar5);
        wVar5 = ptVar7->idx;
        ppVar4 = &p->state;
        puVar3 = &stack0xfffffffffffffd28;
        for (lVar2 = 0x13c; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar3 = (char)ppVar4->stat_add[0];
          ppVar4 = (player_state_conflict *)((long)ppVar4 + (ulong)bVar8 * -2 + 1);
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
        }
      }
      _Var1 = player_resists_effects(in_stack_fffffffffffffd28,wVar5);
      break;
    case 3:
      wVar5 = ptVar7->idx;
      if (0x1b < (uint)wVar5) {
        __assert_fail("f->idx >= 0 && f->idx < ELEM_MAX",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                      ,0x3dd,"_Bool player_inc_check(struct player *, int, _Bool)");
      }
      if (lore) {
        memcpy(local_170,&p->known_state,0x13c);
        puVar3 = local_170;
        puVar6 = &stack0xfffffffffffffd28;
        for (lVar2 = 0x13c; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar6 = *puVar3;
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
          puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
        }
      }
      else {
        equip_learn_element(p,wVar5);
        wVar5 = ptVar7->idx;
        ppVar4 = &p->state;
        puVar3 = &stack0xfffffffffffffd28;
        for (lVar2 = 0x13c; lVar2 != 0; lVar2 = lVar2 + -1) {
          *puVar3 = (char)ppVar4->stat_add[0];
          ppVar4 = (player_state_conflict *)((long)ppVar4 + (ulong)bVar8 * -2 + 1);
          puVar3 = puVar3 + (ulong)bVar8 * -2 + 1;
        }
      }
      _Var1 = player_is_vulnerable(in_stack_fffffffffffffd28,wVar5);
      break;
    case 4:
      flag = ptVar7->idx;
      if (lore) {
        size = 10;
        fi = "p->known_state.pflags";
        flags = (p->known_state).pflags;
        goto LAB_001b3280;
      }
      size = 10;
      fi = "p->state.pflags";
      fl = "(f->idx)";
      flags = (p->state).pflags;
LAB_001b32eb:
      _Var1 = flag_has_dbg(flags,size,flag,fi,fl);
      break;
    case 5:
      goto switchD_001b31d7_caseD_5;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                    ,0x406,"_Bool player_inc_check(struct player *, int, _Bool)");
    }
    if (_Var1 != false) goto LAB_001b33be;
  } while( true );
switchD_001b31d7_caseD_5:
  if (0x34 < (ulong)(uint)ptVar7->idx) {
    __assert_fail("f->idx >= 0 && f->idx < TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x3fe,"_Bool player_inc_check(struct player *, int, _Bool)");
  }
  if (p->timed[(uint)ptVar7->idx] != 0) {
LAB_001b33be:
    return ptVar7 == (timed_failure *)0x0;
  }
  goto LAB_001b31b2;
}

Assistant:

bool player_inc_check(struct player *p, int idx, bool lore)
{
	struct timed_effect_data *effect = &timed_effects[idx];
	struct timed_failure *f = effect->fail;

	while (f) {
		switch (f->code) {
		case TMD_FAIL_FLAG_OBJECT:
			/* Effect is inhibited by an object flag */
			if (lore) {
				if (of_has(p->known_state.flags, f->idx)) {
					return false;
				}
			} else {
				/*
				 * If the effect is from a monster action,
				 * extra stuff happens.
				 */
				struct monster *mon = cave->mon_current > 0 ?
					cave_monster(cave, cave->mon_current) :
					NULL;

				equip_learn_flag(p, f->idx);
				if (mon) {
					update_smart_learn(mon, p, f->idx,
						0, -1);
				}
				if (player_of_has(p, f->idx)) {
					if (mon) {
						msg("You resist the effect!");
					}
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_RESIST:
			/* Effect is inhibited by a resist */
			assert(f->idx >= 0 && f->idx < ELEM_MAX);
			if (lore) {
				if (player_resists_effects(p->known_state, f->idx)) {
					return false;
				}
			} else {
				equip_learn_element(p, f->idx);
				if (player_resists_effects(p->state, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_VULN:
			/*
			 * Effect is inhibited by a vulnerability
			 * the asymmetry with resists is OK for now - NRM
			 */
			assert(f->idx >= 0 && f->idx < ELEM_MAX);
			if (lore) {
				if (player_is_vulnerable(p->known_state, f->idx)) {
					return false;
				}
			} else {
				equip_learn_element(p, f->idx);
				if (player_is_vulnerable(p->state, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_PLAYER:
			/* Effect is inhibited by a player flag */
			if (lore) {
				if (pf_has(p->known_state.pflags, f->idx)) {
					return false;
				}
			} else {
				if (player_has(p, f->idx)) {
					return false;
				}
			}
			break;

		case TMD_FAIL_FLAG_TIMED_EFFECT:
			/*
			 * Effect is inhibited by a timed effect.  If timed
			 * effect is active, it is known to the player, so
			 * there's no difference between whether this is
			 * solely a lore check or not.
			 */
			assert(f->idx >= 0 && f->idx < TMD_MAX);
			if (p->timed[f->idx]) {
				return false;
			}
			break;

		default:
			/* Should never happen. */
			assert(0);
			break;
		}

		f = f->next;
	}

	/* Nothing prevents this effect from incrementing. */
	return true;
}